

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O3

ntuple_list
LineSegmentDetection
          (image_double image,double scale,double sigma_scale,double quant,double ang_th,double eps,
          double density_th,int n_bins,double max_grad,image_int *region)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  image_double piVar8;
  rect *prVar9;
  image_int piVar10;
  image_char used;
  image_double piVar11;
  long lVar12;
  ntuple_list pnVar13;
  void *pvVar14;
  void *__ptr;
  uint uVar15;
  rect *in_RCX;
  long *plVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  double *pdVar21;
  undefined8 *extraout_RDX;
  long lVar22;
  long lVar23;
  image_double angles;
  long *extraout_RDX_00;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined4 in_register_00000034;
  long *plVar27;
  uint uVar28;
  image_double piVar29;
  uint *in_R8;
  ulong uVar30;
  uint *puVar31;
  uint *puVar32;
  rect *in_R9;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  ntuple_list pnVar41;
  double dVar42;
  double extraout_XMM0_Qa;
  double prec;
  double extraout_XMM0_Qa_00;
  double dVar43;
  double scale_00;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  undefined8 in_XMM1_Qb;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined4 uVar52;
  undefined4 uVar53;
  undefined1 auVar54 [16];
  double dVar55;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar59;
  double dVar60;
  int reg_size;
  coorlist *list_p;
  image_double modgrad;
  double reg_angle;
  void *mem_p;
  double dStackY_3b8;
  double dStackY_3a8;
  long *plStackY_358;
  uint uStackY_350;
  ulong uStackY_338;
  uint local_27c;
  undefined1 local_278 [16];
  double local_260;
  undefined1 local_258 [16];
  double local_240;
  ntuple_list local_238;
  uint local_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  undefined1 local_1c8 [16];
  double local_1b8;
  double dStack_1b0;
  undefined1 local_1a8 [16];
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double local_158;
  ulong local_150;
  ulong local_148;
  double *local_140;
  double local_138;
  image_int *local_128;
  double local_120;
  double local_118;
  ulong local_110;
  image_double local_108;
  image_double local_100;
  ulong local_f8;
  coorlist *local_f0;
  rect local_e8;
  double *local_88;
  undefined8 uStack_80;
  double *local_78;
  undefined8 uStack_70;
  ulong local_68;
  ntuple_list local_60;
  double local_58;
  void *local_50;
  double local_48;
  double dStack_40;
  
  plVar27 = (long *)CONCAT44(in_register_00000034,n_bins);
  puVar31 = (uint *)(ulong)(uint)n_bins;
  local_278._8_8_ = in_XMM1_Qb;
  local_278._0_8_ = sigma_scale;
  piVar29 = (image_double)0x5;
  local_240 = ang_th;
  local_158 = eps;
  local_138 = scale;
  local_128 = region;
  local_120 = quant;
  local_118 = density_th;
  local_e8.y1 = max_grad;
  local_60 = new_ntuple_list(5);
  if ((((image == (image_double)0x0) || (image->data == (double *)0x0)) || (image->xsize == 0)) ||
     (image->ysize == 0)) {
    LineSegmentDetection();
LAB_00105c1a:
    LineSegmentDetection();
LAB_00105c1f:
    LineSegmentDetection();
LAB_00105c24:
    LineSegmentDetection();
    goto LAB_00105c29;
  }
  if (local_138 <= 0.0) {
LAB_00105c33:
    LineSegmentDetection();
LAB_00105c38:
    LineSegmentDetection();
LAB_00105c3d:
    LineSegmentDetection();
LAB_00105c42:
    LineSegmentDetection();
LAB_00105c47:
    LineSegmentDetection();
LAB_00105c4c:
    LineSegmentDetection();
LAB_00105c51:
    puVar31 = in_R8;
    LineSegmentDetection();
  }
  else {
    sigma_scale = local_118;
    quant = local_120;
    if ((double)local_278._0_8_ <= 0.0) goto LAB_00105c38;
    if (local_120 < 0.0) goto LAB_00105c3d;
    quant = local_240;
    if ((local_240 <= 0.0) || (180.0 <= local_240)) goto LAB_00105c42;
    if ((local_118 < 0.0) || (1.0 < local_118)) goto LAB_00105c47;
    if (n_bins < 1) goto LAB_00105c4c;
    if (local_e8.y1 <= 0.0) goto LAB_00105c51;
    local_260 = (local_240 * 3.141592653589793) / 180.0;
    dVar42 = sin(local_260);
    dVar42 = local_120 / dVar42;
    if ((local_138 != 1.0) || (NAN(local_138))) {
      sigma_scale = dVar42;
      if ((image->data == (double *)0x0) || (image->xsize == 0)) {
LAB_00105c29:
        LineSegmentDetection();
      }
      else {
        uVar39 = image->ysize;
        if (uVar39 == 0) goto LAB_00105c29;
        auVar45._0_8_ = (double)image->xsize * local_138;
        sigma_scale = local_138;
        local_120 = dVar42;
        local_e8.dx = (double)image;
        local_e8.dy._4_4_ = n_bins;
        if (auVar45._0_8_ <= 4294967295.0) {
          quant = (double)uVar39 * local_138;
          local_258._0_8_ = quant;
          if (quant <= 4294967295.0) {
            dVar42 = floor(auVar45._0_8_);
            auVar45._0_8_ = floor((double)local_258._0_8_);
            piVar8 = new_image_double((uint)(long)dVar42,uVar39);
            local_108 = new_image_double((uint)(long)dVar42,(uint)(long)auVar45._0_8_);
            dStack_40 = local_278._8_8_;
            local_48 = (double)(~-(ulong)(local_138 < 1.0) & (ulong)local_278._0_8_ |
                               (ulong)(local_278._0_8_ / local_138) & -(ulong)(local_138 < 1.0));
            auVar45 = local_278;
            dVar42 = ceil(local_48 * 3.7169221888498387);
            uVar40 = (ulong)dVar42;
            iVar25 = (int)uVar40;
            local_238 = new_ntuple_list(iVar25 * 2 + 1);
            local_e8.prec = (double)(ulong)*(uint *)((long)local_e8.dx + 0xc);
            local_68 = uVar40 & 0xffffffff;
            local_278._0_4_ = piVar8->xsize;
            piVar29 = (image_double)local_e8.dx;
            local_110 = uVar40;
            local_100 = piVar8;
            if (piVar8->xsize != 0) {
              uVar39 = *(uint *)((long)local_e8.dx + 8);
              iVar38 = uVar39 * 2;
              local_e8.x2 = (double)local_68;
              uVar36 = iVar38 + (uint)(iVar38 == 0);
              local_f8 = CONCAT44(local_f8._4_4_,iVar25 + -1);
              local_148 = 0;
              dVar42 = 0.0;
              do {
                local_258._0_8_ = dVar42 / local_138;
                local_e8.y2 = dVar42;
                local_168 = floor(dVar42 / local_138 + 0.5);
                gaussian_kernel(local_238,local_48,
                                ((double)local_258._0_8_ + local_e8.x2) - (double)(int)local_168);
                local_e8.y = (double)(ulong)local_100->ysize;
                if ((double *)local_e8.y != (double *)0x0) {
                  local_22c = (uint)local_168;
                  prVar9 = (rect *)CONCAT44(0,local_238->dim);
                  local_258._0_8_ = prVar9;
                  local_e8.x = (double)local_100->data;
                  iVar17 = local_22c - (int)local_110;
                  local_150 = CONCAT44(local_150._4_4_,iVar17);
                  iVar4 = (int)local_110 - local_22c;
                  local_e8.width = (double)CONCAT44(local_e8.width._4_4_,iVar4);
                  pdVar21 = (double *)0x0;
                  do {
                    if (prVar9 == (rect *)0x0) {
                      dVar42 = 0.0;
                    }
                    else {
                      uVar6 = piVar29->xsize;
                      local_78 = piVar29->data;
                      local_168 = (double)CONCAT44(local_168._4_4_,uVar6);
                      iVar5 = uVar6 * (int)pdVar21;
                      local_88 = (double *)CONCAT44(local_88._4_4_,iVar5);
                      local_140 = local_238->values;
                      dVar42 = 0.0;
                      in_R9 = (rect *)0x0;
                      iVar24 = iVar4;
                      iVar33 = iVar17;
                      uVar35 = local_22c;
                      do {
                        iVar18 = 0;
                        if (0 < iVar33) {
                          iVar18 = iVar33;
                        }
                        uVar34 = (uint)(iVar18 + iVar24 != 0);
                        uVar15 = (iVar18 + iVar24) - uVar34;
                        uVar28 = uVar35;
                        do {
                          uVar28 = uVar28 + uVar39 * -2;
                          iVar18 = ((uVar15 / uVar36 + uVar34) * 2 + 2) * uVar39 + -iVar25 + uVar28;
                        } while (SBORROW4(iVar18,iVar38) == (int)(iVar18 + uVar39 * -2) < 0);
                        iVar19 = -iVar25 + uVar28;
                        iVar18 = ((uVar15 / uVar36 + uVar34) * 2 + 2) * uVar39 + iVar19;
                        if ((int)uVar6 <=
                            (int)(((uVar15 / uVar36 + uVar34) * 2 + 2) * uVar39 + iVar19)) {
                          iVar18 = ((int)local_f8 - (uVar15 / uVar36 + uVar34) * iVar38) - uVar28;
                        }
                        dVar42 = dVar42 + local_78[(uint)(iVar18 + iVar5)] * local_140[(long)in_R9];
                        in_R9 = (rect *)((long)&in_R9->x1 + 1);
                        iVar33 = iVar33 + 1;
                        iVar24 = iVar24 + -1;
                        uVar35 = uVar35 + 1;
                        piVar29 = (image_double)local_e8.dx;
                        local_e8.theta = (double)pdVar21;
                      } while (in_R9 != prVar9);
                    }
                    *(double *)
                     ((long)local_e8.x +
                     (ulong)(uint)((int)pdVar21 * local_278._0_4_ + (int)local_148) * 8) = dVar42;
                    pdVar21 = (double *)((long)pdVar21 + 1);
                  } while (pdVar21 != (double *)local_e8.y);
                }
                dVar42 = local_e8.y2 + 1.0;
                uVar6 = (int)local_148 + 1;
                local_148 = (ulong)uVar6;
              } while (uVar6 != local_278._0_4_);
            }
            quant = auVar45._0_8_;
            local_e8.y2 = (double)CONCAT44(local_e8.y2._4_4_,local_108->ysize);
            if (local_108->ysize != 0) {
              iVar25 = SUB84(local_e8.prec,0);
              iVar38 = iVar25 * 2;
              local_e8.x2 = (double)(long)local_68;
              uVar39 = iVar38 + (uint)(iVar38 == 0);
              iVar4 = -(int)local_110;
              local_140 = (double *)CONCAT44(local_140._4_4_,(int)local_110 + -1);
              local_150 = 0;
              dVar42 = 0.0;
              do {
                local_258._0_8_ = dVar42 / local_138;
                local_e8.width = dVar42;
                local_168 = floor(dVar42 / local_138 + 0.5);
                gaussian_kernel(local_238,local_48,
                                ((double)local_258._0_8_ + local_e8.x2) - (double)(int)local_168);
                quant = auVar45._0_8_;
                local_f8 = (ulong)local_108->xsize;
                if (local_f8 != 0) {
                  iVar24 = (int)local_168;
                  uVar40 = CONCAT44(0,local_238->dim);
                  local_258._0_8_ = uVar40;
                  local_e8.theta = (double)local_108->data;
                  iVar17 = local_108->xsize * (int)local_150;
                  local_148 = CONCAT44(local_148._4_4_,iVar17);
                  iVar33 = iVar24 - (int)local_110;
                  local_e8.x = (double)CONCAT44(local_e8.x._4_4_,iVar33);
                  local_e8.y = (double)CONCAT44(local_e8.y._4_4_,iVar24);
                  local_22c = (int)local_110 - iVar24;
                  uVar30 = 0;
                  do {
                    if (uVar40 == 0) {
                      dVar42 = 0.0;
                    }
                    else {
                      puVar31 = &piVar29->ysize;
                      local_168 = (double)CONCAT44(local_168._4_4_,*puVar31);
                      local_78 = local_100->data;
                      local_88 = local_238->values;
                      dVar42 = 0.0;
                      uVar37 = 0;
                      in_R9 = (rect *)(ulong)local_22c;
                      iVar5 = iVar24;
                      iVar18 = iVar33;
                      do {
                        iVar19 = 0;
                        if (0 < iVar18) {
                          iVar19 = iVar18;
                        }
                        iVar19 = iVar19 + (int)in_R9;
                        uVar6 = (uint)(iVar19 != 0);
                        uVar36 = iVar19 - uVar6;
                        iVar26 = SUB84(local_e8.prec,0);
                        iVar19 = iVar5;
                        do {
                          iVar19 = iVar19 + iVar25 * -2;
                        } while (iVar38 <= (int)(((uVar36 / uVar39 + uVar6) * 2 + 2) * iVar26 +
                                                 iVar4 + iVar19));
                        iVar20 = iVar19 + iVar4;
                        iVar7 = ((uVar36 / uVar39 + uVar6) * 2 + 2) * iVar26 + iVar20;
                        if ((int)*puVar31 <=
                            (int)(((uVar36 / uVar39 + uVar6) * 2 + 2) * iVar26 + iVar20)) {
                          iVar7 = ((int)local_140 - (uVar36 / uVar39 + uVar6) * iVar38) - iVar19;
                        }
                        dVar42 = dVar42 + local_78[(uint)(iVar7 * local_278._0_4_ + (int)uVar30)] *
                                          local_88[uVar37];
                        uVar37 = uVar37 + 1;
                        iVar18 = iVar18 + 1;
                        in_R9 = (rect *)(ulong)((int)in_R9 - 1);
                        iVar5 = iVar5 + 1;
                        piVar29 = (image_double)local_e8.dx;
                      } while (uVar37 != uVar40);
                    }
                    *(double *)((long)local_e8.theta + (ulong)(uint)((int)uVar30 + iVar17) * 8) =
                         dVar42;
                    uVar30 = uVar30 + 1;
                  } while (uVar30 != local_f8);
                }
                dVar42 = local_e8.width + 1.0;
                uVar36 = (int)local_150 + 1;
                local_150 = (ulong)uVar36;
              } while (uVar36 != local_e8.y2._0_4_);
            }
            free_ntuple_list(local_238);
            free_image_double(local_100);
            piVar29 = local_108;
            in_RCX = &local_e8;
            puVar31 = (uint *)(ulong)local_e8.dy._4_4_;
            sigma_scale = local_e8.y1;
            piVar8 = ll_angle(local_108,local_120,&local_f0,&stack0xffffffffffffffb0,
                              (image_double *)in_RCX,local_e8.dy._4_4_,local_e8.y1);
            free_image_double(piVar29);
            goto LAB_00104dd5;
          }
        }
      }
      LineSegmentDetection();
      goto LAB_00105c33;
    }
    in_RCX = &local_e8;
    sigma_scale = local_e8.y1;
    piVar8 = ll_angle(image,dVar42,&local_f0,&stack0xffffffffffffffb0,(image_double *)in_RCX,n_bins,
                      local_e8.y1);
LAB_00104dd5:
    local_240 = local_240 / 180.0;
    uVar39 = piVar8->xsize;
    uVar36 = piVar8->ysize;
    local_258._0_8_ = log10((double)uVar39);
    local_258._8_8_ = extraout_XMM0_Qb;
    local_168 = log10((double)uVar36);
    dVar42 = log10(local_240);
    local_278._0_8_ = dVar42;
    if (local_128 != (image_int *)0x0) {
      uVar6 = piVar8->xsize;
      uVar35 = piVar8->ysize;
      piVar10 = new_image_int(uVar6,uVar35);
      uVar35 = uVar35 * uVar6;
      if (uVar35 != 0) {
        memset(piVar10->data,0,(ulong)uVar35 << 2);
      }
      *local_128 = piVar10;
    }
    used = new_image_char_ini(uVar39,uVar36,'\0');
    piVar29 = (image_double)(ulong)(uVar36 * uVar39);
    plVar27 = (long *)0x8;
    piVar11 = (image_double)calloc((size_t)piVar29,8);
    if (piVar11 != (image_double)0x0) {
      if (local_f0 == (coorlist *)0x0) {
LAB_00105bc9:
        free_image_double(piVar8);
        free_image_double((image_double)local_e8.x1);
        free_image_char(used);
        free(piVar11);
        free(local_50);
        return local_60;
      }
      local_258._0_8_ = ((double)local_258._0_8_ + local_168) * 5.0 * 0.5;
      iVar25 = (int)(-(double)local_258._0_8_ / (double)local_278._0_8_);
      local_e8.prec = local_138;
      local_e8.p = local_138;
      iVar38 = 0;
      local_168 = (double)CONCAT44(local_168._4_4_,iVar25);
      dVar42 = local_260;
LAB_00104f15:
      iVar4 = local_f0->x;
      iVar17 = local_f0->y;
      if ((used->data[used->xsize * iVar17 + iVar4] != '\0') ||
         ((piVar8->data[piVar8->xsize * iVar17 + iVar4] == -1024.0 &&
          (!NAN(piVar8->data[piVar8->xsize * iVar17 + iVar4]))))) goto LAB_00104f2e;
      in_R8 = &local_27c;
      in_R9 = (rect *)&stack0xffffffffffffffa8;
      region_grow(iVar4,iVar17,piVar8,(point *)piVar11,(int *)in_R8,(double *)in_R9,used,dVar42);
      plVar27 = (long *)(ulong)local_27c;
      dVar42 = local_260;
      if ((int)local_27c < iVar25) goto LAB_00104f2e;
      in_RCX = (rect *)local_228;
      piVar29 = piVar11;
      sigma_scale = local_260;
      quant = local_240;
      region2rect((point *)piVar11,local_27c,(image_double)local_e8.x1,local_58,local_260,local_240,
                  in_RCX);
      dVar42 = local_e8.x1;
      local_1c8._0_8_ = local_58;
      if (local_260 < 0.0) goto LAB_00105c24;
      if (used->data == (uchar *)0x0) goto LAB_00105c1f;
      if (piVar8->data == (double *)0x0) goto LAB_00105c1a;
      if (local_118 <=
          (double)(int)local_27c /
          (SQRT(((double)local_218._0_8_ - (double)local_228._0_8_) *
                ((double)local_218._0_8_ - (double)local_228._0_8_) +
                ((double)local_218._8_8_ - (double)local_228._8_8_) *
                ((double)local_218._8_8_ - (double)local_228._8_8_)) * local_208)) {
LAB_00105403:
        dVar42 = rect_nfa((rect *)local_228,piVar8,(double)local_258._0_8_);
        local_278._0_8_ = dVar42;
        if (dVar42 <= local_158) {
          local_1a8._8_8_ = dStack_200;
          local_1a8._0_8_ = local_208;
          local_1c8 = local_228;
          local_1b8 = (double)local_218._0_8_;
          dStack_1b0 = (double)local_218._8_8_;
          local_198 = local_1f8;
          dStack_190 = dStack_1f0;
          local_188 = local_1e8;
          dStack_180 = dStack_1e0;
          dStack_170 = dStack_1d0;
          iVar25 = 5;
          do {
            dStack_170 = dStack_170 * 0.5;
            local_178 = dStack_170 * 3.141592653589793;
            dVar42 = rect_nfa((rect *)local_1c8,piVar8,(double)local_258._0_8_);
            if ((double)local_278._0_8_ < dVar42) {
              local_218._8_8_ = dStack_1b0;
              local_218._0_8_ = local_1b8;
              local_228 = local_1c8;
              local_208 = (double)local_1a8._0_8_;
              dStack_200 = (double)local_1a8._8_8_;
              local_1f8 = local_198;
              dStack_1f0 = dStack_190;
              local_1e8 = local_188;
              dStack_1e0 = dStack_180;
              local_1d8 = local_178;
              dStack_1d0 = dStack_170;
              local_278._0_8_ = dVar42;
            }
            iVar25 = iVar25 + -1;
          } while (iVar25 != 0);
          if ((double)local_278._0_8_ <= local_158) {
            local_1a8._8_8_ = dStack_200;
            local_1a8._0_8_ = local_208;
            local_1c8 = local_228;
            local_1b8 = (double)local_218._0_8_;
            dStack_1b0 = (double)local_218._8_8_;
            local_198 = local_1f8;
            dStack_190 = dStack_1f0;
            local_188 = local_1e8;
            dStack_180 = dStack_1e0;
            local_178 = local_1d8;
            dStack_170 = dStack_1d0;
            iVar25 = 5;
            do {
              if (0.5 <= (double)local_1a8._0_8_ + -0.5) {
                local_1a8._0_8_ = (double)local_1a8._0_8_ + -0.5;
                dVar42 = rect_nfa((rect *)local_1c8,piVar8,(double)local_258._0_8_);
                if ((double)local_278._0_8_ < dVar42) {
                  local_218._8_8_ = dStack_1b0;
                  local_218._0_8_ = local_1b8;
                  local_228 = local_1c8;
                  local_208 = (double)local_1a8._0_8_;
                  dStack_200 = (double)local_1a8._8_8_;
                  local_1f8 = local_198;
                  dStack_1f0 = dStack_190;
                  local_1e8 = local_188;
                  dStack_1e0 = dStack_180;
                  local_1d8 = local_178;
                  dStack_1d0 = dStack_170;
                  local_278._0_8_ = dVar42;
                }
              }
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
            if ((double)local_278._0_8_ <= local_158) {
              local_1a8._8_8_ = dStack_200;
              local_1a8._0_8_ = local_208;
              local_1c8 = local_228;
              local_1b8 = (double)local_218._0_8_;
              dStack_1b0 = (double)local_218._8_8_;
              local_198 = local_1f8;
              dStack_190 = dStack_1f0;
              local_188 = local_1e8;
              dStack_180 = dStack_1e0;
              local_178 = local_1d8;
              dStack_170 = dStack_1d0;
              iVar25 = 5;
              do {
                if (0.5 <= (double)local_1a8._0_8_ + -0.5) {
                  local_1c8._0_8_ = (double)local_1c8._0_8_ + -dStack_180 * 0.25;
                  local_1c8._8_8_ = (double)local_1c8._8_8_ + local_188 * 0.25;
                  local_1b8 = -dStack_180 * 0.25 + local_1b8;
                  dStack_1b0 = local_188 * 0.25 + dStack_1b0;
                  local_1a8._0_8_ = (double)local_1a8._0_8_ + -0.5;
                  dVar42 = rect_nfa((rect *)local_1c8,piVar8,(double)local_258._0_8_);
                  if ((double)local_278._0_8_ < dVar42) {
                    local_218._8_8_ = dStack_1b0;
                    local_218._0_8_ = local_1b8;
                    local_228 = local_1c8;
                    local_208 = (double)local_1a8._0_8_;
                    dStack_200 = (double)local_1a8._8_8_;
                    local_1f8 = local_198;
                    dStack_1f0 = dStack_190;
                    local_1e8 = local_188;
                    dStack_1e0 = dStack_180;
                    local_1d8 = local_178;
                    dStack_1d0 = dStack_170;
                    local_278._0_8_ = dVar42;
                  }
                }
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
              if ((double)local_278._0_8_ <= local_158) {
                local_1a8._8_8_ = dStack_200;
                local_1a8._0_8_ = local_208;
                local_1c8 = local_228;
                local_1b8 = (double)local_218._0_8_;
                dStack_1b0 = (double)local_218._8_8_;
                local_198 = local_1f8;
                dStack_190 = dStack_1f0;
                local_188 = local_1e8;
                dStack_180 = dStack_1e0;
                local_178 = local_1d8;
                dStack_170 = dStack_1d0;
                iVar25 = 5;
                do {
                  if (0.5 <= (double)local_1a8._0_8_ + -0.5) {
                    local_1c8._0_8_ = (double)local_1c8._0_8_ + dStack_180 * 0.25;
                    local_1c8._8_8_ = (double)local_1c8._8_8_ + -local_188 * 0.25;
                    local_1b8 = dStack_180 * 0.25 + local_1b8;
                    dStack_1b0 = -local_188 * 0.25 + dStack_1b0;
                    local_1a8._0_8_ = (double)local_1a8._0_8_ + -0.5;
                    dVar42 = rect_nfa((rect *)local_1c8,piVar8,(double)local_258._0_8_);
                    if ((double)local_278._0_8_ < dVar42) {
                      local_218._8_8_ = dStack_1b0;
                      local_218._0_8_ = local_1b8;
                      local_228 = local_1c8;
                      local_208 = (double)local_1a8._0_8_;
                      dStack_200 = (double)local_1a8._8_8_;
                      local_1f8 = local_198;
                      dStack_1f0 = dStack_190;
                      local_1e8 = local_188;
                      dStack_1e0 = dStack_180;
                      local_1d8 = local_178;
                      dStack_1d0 = dStack_170;
                      local_278._0_8_ = dVar42;
                    }
                  }
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
                if ((double)local_278._0_8_ <= local_158) {
                  local_1a8._8_8_ = dStack_200;
                  local_1a8._0_8_ = local_208;
                  local_1c8 = local_228;
                  local_1b8 = (double)local_218._0_8_;
                  dStack_1b0 = (double)local_218._8_8_;
                  local_198 = local_1f8;
                  dStack_190 = dStack_1f0;
                  local_188 = local_1e8;
                  dStack_180 = dStack_1e0;
                  dStack_170 = dStack_1d0;
                  iVar25 = 5;
                  do {
                    dStack_170 = dStack_170 * 0.5;
                    local_178 = dStack_170 * 3.141592653589793;
                    dVar42 = rect_nfa((rect *)local_1c8,piVar8,(double)local_258._0_8_);
                    if ((double)local_278._0_8_ < dVar42) {
                      local_218._8_8_ = dStack_1b0;
                      local_218._0_8_ = local_1b8;
                      local_228 = local_1c8;
                      local_208 = (double)local_1a8._0_8_;
                      dStack_200 = (double)local_1a8._8_8_;
                      local_1f8 = local_198;
                      dStack_1f0 = dStack_190;
                      local_1e8 = local_188;
                      dStack_1e0 = dStack_180;
                      local_1d8 = local_178;
                      dStack_1d0 = dStack_170;
                      local_278._0_8_ = dVar42;
                    }
                    iVar25 = iVar25 + -1;
                  } while (iVar25 != 0);
                }
              }
            }
          }
        }
        if (local_158 < (double)local_278._0_8_) {
          local_218._0_8_ = (double)local_218._0_8_ + 0.5;
          local_218._8_8_ = (double)local_218._8_8_ + 0.5;
          local_228._0_8_ = (double)local_228._0_8_ + 0.5;
          local_228._8_8_ = (double)local_228._8_8_ + 0.5;
          iVar25 = local_168._0_4_;
          if ((local_138 != 1.0) || (NAN(local_138))) {
            auVar3._8_8_ = local_e8.p;
            auVar3._0_8_ = local_e8.prec;
            local_218 = divpd(local_218,auVar3);
            local_228 = divpd(local_228,auVar3);
            local_208 = local_208 / local_138;
          }
          iVar38 = iVar38 + 1;
          add_5tuple(local_60,local_228._0_8_,local_228._8_8_,local_218._0_8_,local_218._8_8_,
                     local_208);
          dVar42 = local_260;
          if ((local_128 != (image_int *)0x0) && (0 < (int)local_27c)) {
            piVar10 = *local_128;
            piVar1 = piVar10->data;
            lVar12 = 0;
            do {
              piVar1[piVar10->xsize * *(int *)((long)&piVar11->data + lVar12 * 8 + 4) +
                     *(int *)(&piVar11->data + lVar12)] = iVar38;
              lVar12 = lVar12 + 1;
            } while (lVar12 < (int)local_27c);
          }
          goto LAB_00104f2e;
        }
      }
      else {
        if ((int)local_27c < 1) {
          dVar60 = 0.0;
          dVar47 = 0.0;
          auVar45._0_8_ = 0.0;
        }
        else {
          iVar25 = *(int *)&piVar11->data;
          iVar4 = *(int *)((long)&piVar11->data + 4);
          auVar45._0_8_ = piVar8->data[iVar4 * piVar8->xsize + iVar25];
          dVar47 = 0.0;
          lVar12 = 0;
          iVar17 = 0;
          auVar58 = ZEXT816(0);
          do {
            used->data
            [used->xsize * *(int *)((long)&piVar11->data + lVar12 * 8 + 4) +
             *(int *)(&piVar11->data + lVar12)] = '\0';
            iVar24 = *(int *)((long)&piVar11->data + lVar12 * 8 + 4);
            dVar60 = (double)*(int *)(&piVar11->data + lVar12) - (double)iVar25;
            dVar55 = (double)iVar24 - (double)iVar4;
            if (SQRT(dVar60 * dVar60 + dVar55 * dVar55) < local_208) {
              for (dVar60 = piVar8->data[iVar24 * piVar8->xsize + *(int *)(&piVar11->data + lVar12)]
                            - auVar45._0_8_; dVar60 <= -3.141592653589793;
                  dVar60 = dVar60 + 6.28318530718) {
              }
              for (; 3.141592653589793 < dVar60; dVar60 = dVar60 + -6.28318530718) {
              }
              auVar58._0_8_ = auVar58._0_8_ + dVar60;
              dVar47 = dVar47 + dVar60 * dVar60;
              iVar17 = iVar17 + 1;
            }
            dVar60 = auVar58._0_8_;
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)local_27c);
          auVar45._0_8_ = (double)iVar17;
        }
        dVar55 = dVar60 / auVar45._0_8_;
        auVar45._0_8_ = dVar55 * dVar55 + (dVar55 * -2.0 * dVar60 + dVar47) / auVar45._0_8_;
        if (auVar45._0_8_ < 0.0) {
          auVar45._0_8_ = sqrt(auVar45._0_8_);
        }
        else {
          auVar45._0_8_ = SQRT(auVar45._0_8_);
        }
        puVar31 = &local_27c;
        in_R9 = (rect *)local_1c8;
        region_grow(*(int *)&piVar11->data,*(int *)((long)&piVar11->data + 4),piVar8,
                    (point *)piVar11,(int *)puVar31,(double *)local_1c8,used,
                    auVar45._0_8_ + auVar45._0_8_);
        if (1 < (int)local_27c) {
          in_RCX = (rect *)local_228;
          piVar29 = piVar11;
          region2rect((point *)piVar11,local_27c,(image_double)dVar42,(double)local_1c8._0_8_,
                      local_260,local_240,in_RCX);
          plVar27 = (long *)(ulong)local_27c;
          auVar45._0_8_ =
               (double)(int)local_27c /
               (SQRT(((double)local_218._0_8_ - (double)local_228._0_8_) *
                     ((double)local_218._0_8_ - (double)local_228._0_8_) +
                     ((double)local_218._8_8_ - (double)local_228._8_8_) *
                     ((double)local_218._8_8_ - (double)local_228._8_8_)) * local_208);
          if (local_118 <= auVar45._0_8_) goto LAB_00105403;
          sigma_scale = (double)local_228._8_8_;
          quant = (double)local_218._8_8_;
          if (used->data == (uchar *)0x0) goto LAB_00105c5b;
          if (piVar8->data == (double *)0x0) goto LAB_00105c60;
          if (auVar45._0_8_ < local_118) {
            local_78 = (double *)(double)*(int *)&piVar11->data;
            local_88 = (double *)(double)*(int *)((long)&piVar11->data + 4);
            local_140 = (double *)local_1c8._0_8_;
            auVar49._8_8_ = local_88;
            auVar49._0_8_ = local_88;
            auVar44._0_8_ =
                 ((double)local_228._0_8_ - (double)local_78) *
                 ((double)local_228._0_8_ - (double)local_78) +
                 ((double)local_228._8_8_ - (double)local_88) *
                 ((double)local_228._8_8_ - (double)local_88);
            auVar44._8_8_ =
                 ((double)local_218._0_8_ - (double)local_78) *
                 ((double)local_218._0_8_ - (double)local_78) +
                 ((double)local_218._8_8_ - (double)local_88) *
                 ((double)local_218._8_8_ - (double)local_88);
            auVar50 = sqrtpd(auVar49,auVar44);
            if (auVar50._0_8_ <= auVar50._8_8_) {
              auVar50._0_8_ = auVar50._8_8_;
            }
            uStack_70 = 0;
            uStack_80 = 0;
            do {
              auVar51._8_8_ = auVar50._8_8_;
              auVar51._0_8_ = auVar50._0_8_ * 0.75;
              if ((int)plVar27 < 1) goto LAB_00105bb7;
              iVar25 = 0;
              do {
                lVar12 = (long)iVar25;
                iVar4 = *(int *)((long)&piVar11->data + lVar12 * 8 + 4);
                auVar45._0_8_ = (double)*(int *)(&piVar11->data + lVar12) - (double)local_78;
                dVar47 = (double)iVar4 - (double)local_88;
                if (auVar51._0_8_ < SQRT(auVar45._0_8_ * auVar45._0_8_ + dVar47 * dVar47)) {
                  used->data[iVar4 * used->xsize + *(int *)(&piVar11->data + lVar12)] = '\0';
                  (&piVar11->data)[lVar12] =
                       *(double **)((long)piVar11 + (long)(int)local_27c * 8 + -8);
                  local_27c = local_27c - 1;
                  plVar27 = (long *)(ulong)local_27c;
                  iVar25 = iVar25 + -1;
                }
                iVar25 = iVar25 + 1;
                iVar4 = (int)plVar27;
              } while (iVar25 < iVar4);
              if (iVar4 < 2) goto LAB_00105bb7;
              local_278 = auVar51;
              region2rect((point *)piVar11,iVar4,(image_double)dVar42,(double)local_140,local_260,
                          local_240,(rect *)local_228);
              plVar27 = (long *)(ulong)local_27c;
              auVar50 = local_278;
            } while ((double)(int)local_27c /
                     (SQRT(((double)local_218._0_8_ - (double)local_228._0_8_) *
                           ((double)local_218._0_8_ - (double)local_228._0_8_) +
                           ((double)local_218._8_8_ - (double)local_228._8_8_) *
                           ((double)local_218._8_8_ - (double)local_228._8_8_)) * local_208) <
                     local_118);
          }
          goto LAB_00105403;
        }
      }
LAB_00105bb7:
      iVar25 = local_168._0_4_;
      dVar42 = local_260;
LAB_00104f2e:
      local_f0 = local_f0->next;
      if (local_f0 == (coorlist *)0x0) goto code_r0x00104f47;
      goto LAB_00104f15;
    }
  }
  LineSegmentDetection();
LAB_00105c5b:
  LineSegmentDetection();
LAB_00105c60:
  LineSegmentDetection();
  if ((piVar29 == (image_double)0x0) || (piVar29->data == (double *)0x0)) {
LAB_00106086:
    ll_angle();
    prVar9 = in_RCX;
    piVar8 = piVar29;
    puVar32 = puVar31;
    dVar42 = sigma_scale;
LAB_0010608b:
    ll_angle();
LAB_00106090:
    ll_angle();
LAB_00106095:
    ll_angle();
LAB_0010609a:
    ll_angle();
LAB_0010609f:
    ll_angle();
LAB_001060a4:
    uVar6 = (uint)plVar27;
    ll_angle();
  }
  else {
    uVar39 = piVar29->xsize;
    uVar40 = (ulong)uVar39;
    if (uVar40 == 0) goto LAB_00106086;
    uVar36 = piVar29->ysize;
    uVar30 = (ulong)uVar36;
    if (uVar30 == 0) goto LAB_00106086;
    prVar9 = in_RCX;
    piVar8 = piVar29;
    puVar32 = puVar31;
    dVar42 = sigma_scale;
    if (extraout_XMM0_Qa < 0.0) goto LAB_0010608b;
    if (plVar27 == (long *)0x0) goto LAB_00106090;
    if (extraout_RDX == (undefined8 *)0x0) goto LAB_00106095;
    if (in_RCX == (rect *)0x0) goto LAB_0010609a;
    uStackY_350 = (uint)puVar31;
    if (uStackY_350 == 0) goto LAB_0010609f;
    if (sigma_scale <= 0.0) goto LAB_001060a4;
    pnVar13 = (ntuple_list)new_image_double(uVar39,uVar36);
    piVar8 = new_image_double(piVar29->xsize,piVar29->ysize);
    in_RCX->x1 = (double)piVar8;
    pvVar14 = calloc((ulong)(uVar36 * uVar39),0x10);
    *extraout_RDX = pvVar14;
    piVar11 = (image_double)((ulong)puVar31 & 0xffffffff);
    plStackY_358 = (long *)calloc((size_t)piVar11,8);
    uVar6 = 8;
    piVar8 = piVar11;
    __ptr = calloc((size_t)piVar11,8);
    if (((pvVar14 != (void *)0x0) && (plStackY_358 != (long *)0x0)) && (__ptr != (void *)0x0)) {
      lVar12 = *(long *)pnVar13;
      uVar36 = uVar36 - 1;
      uVar6 = uVar36 * uVar39;
      do {
        *(undefined8 *)(lVar12 + (ulong)uVar6 * 8) = 0xc090000000000000;
        uVar6 = uVar6 + 1;
        uVar40 = uVar40 - 1;
      } while (uVar40 != 0);
      uVar6 = uVar39 - 1;
      do {
        *(undefined8 *)(lVar12 + (ulong)uVar6 * 8) = 0xc090000000000000;
        uVar6 = uVar6 + uVar39;
        uVar30 = uVar30 - 1;
      } while (uVar30 != 0);
      if (uVar39 != 1) {
        uStackY_338 = 0;
        iVar25 = 0;
        uVar6 = uVar39;
        do {
          iVar38 = (int)uStackY_338;
          if (uVar36 != 0) {
            uVar40 = 0;
            uVar35 = uVar6;
            do {
              pdVar21 = piVar29->data;
              dVar42 = (pdVar21[uVar35 + 1] - pdVar21[uStackY_338]) +
                       (pdVar21[(int)uStackY_338 + 1] - pdVar21[uVar35]);
              dVar47 = (pdVar21[uVar35 + 1] - pdVar21[uStackY_338]) -
                       (pdVar21[(int)uStackY_338 + 1] - pdVar21[uVar35]);
              auVar45._0_8_ = (dVar42 * dVar42 + dVar47 * dVar47) * 0.25;
              if (auVar45._0_8_ < 0.0) {
                auVar45._0_8_ = sqrt(auVar45._0_8_);
              }
              else {
                auVar45._0_8_ = SQRT(auVar45._0_8_);
              }
              *(double *)(*(long *)in_RCX->x1 + uStackY_338 * 8) = auVar45._0_8_;
              if (auVar45._0_8_ <= extraout_XMM0_Qa) {
                *(undefined8 *)(lVar12 + uStackY_338 * 8) = 0xc090000000000000;
              }
              else {
                dVar42 = atan2(dVar42,-dVar47);
                uVar30 = (ulong)((auVar45._0_8_ * (double)(long)piVar11) / sigma_scale);
                *(double *)(lVar12 + uStackY_338 * 8) = dVar42;
                uVar37 = uVar30 & 0xffffffff;
                if (uStackY_350 <= (uint)uVar30) {
                  uVar37 = (ulong)(uStackY_350 - 1);
                }
                lVar23 = *(long *)((long)__ptr + uVar37 * 8);
                lVar22 = (long)iVar25 * 0x10;
                plVar16 = plStackY_358 + uVar37;
                if (lVar23 != 0) {
                  plVar16 = (long *)(lVar23 + 8);
                }
                *plVar16 = (long)pvVar14 + lVar22;
                *(void **)((long)__ptr + uVar37 * 8) = (void *)((long)pvVar14 + lVar22);
                iVar25 = iVar25 + 1;
                *(int *)((long)pvVar14 + lVar22) = iVar38;
                *(int *)((long)pvVar14 + lVar22 + 4) = (int)uVar40;
                *(undefined8 *)((long)pvVar14 + lVar22 + 8) = 0;
              }
              uVar40 = uVar40 + 1;
              uVar35 = uVar35 + uVar39;
              uStackY_338 = (ulong)((int)uStackY_338 + uVar39);
            } while (uVar36 != uVar40);
          }
          uVar35 = iVar38 + 1;
          uStackY_338 = (ulong)uVar35;
          uVar6 = uVar6 + 1;
        } while (uVar35 != uVar39 - 1);
      }
      iVar25 = -uStackY_350;
      do {
        iVar38 = iVar25;
        uStackY_350 = uStackY_350 - 1;
        if (iVar38 == -1) {
          lVar12 = *plStackY_358;
          uVar40 = 0;
          if (lVar12 != 0) goto LAB_00106019;
          lVar12 = 0;
          goto LAB_0010605a;
        }
        lVar12 = plStackY_358[uStackY_350];
        iVar25 = iVar38 + 1;
      } while (lVar12 == 0);
      if (iVar25 != -1) {
        uVar40 = (ulong)(uint)-iVar25;
LAB_00106019:
        lVar23 = *(long *)((long)__ptr + uVar40 * 8);
        uVar40 = (ulong)(-iVar38 - 2);
        do {
          uVar30 = uVar40 - 1;
          if (plStackY_358[uVar40] != 0) {
            *(long *)(lVar23 + 8) = plStackY_358[uVar40];
            lVar23 = *(long *)((long)__ptr + uVar30 * 8 + 8);
          }
          uVar40 = uVar30;
        } while ((int)uVar30 != 0);
      }
LAB_0010605a:
      *plVar27 = lVar12;
      free(plStackY_358);
      free(__ptr);
      return pnVar13;
    }
  }
  ll_angle();
  uVar39 = (uint)piVar8;
  if ((((int)(uVar6 | uVar39) < 0) || ((int)angles->xsize <= (int)uVar39)) ||
     ((int)angles->ysize <= (int)uVar6)) {
    region_grow();
LAB_001062e6:
    region_grow();
LAB_001062eb:
    region_grow();
LAB_001062f0:
    region_grow();
LAB_001062f5:
    region_grow();
  }
  else {
    pdVar21 = angles->data;
    if (pdVar21 == (double *)0x0) goto LAB_001062eb;
    if (prVar9 == (rect *)0x0) goto LAB_001062f0;
    if (puVar32 == (uint *)0x0) goto LAB_001062f5;
    if (in_R9 != (rect *)0x0) {
      if ((plStackY_358 != (long *)0x0) && (*plStackY_358 != 0)) {
        *puVar32 = 1;
        *(uint *)&prVar9->x1 = uVar39;
        *(uint *)((long)&prVar9->x1 + 4) = uVar6;
        dVar42 = pdVar21[angles->xsize * uVar6 + uVar39];
        in_R9->x1 = dVar42;
        dStackY_3b8 = cos(dVar42);
        dStackY_3a8 = sin(in_R9->x1);
        pnVar13 = (ntuple_list)*plStackY_358;
        *(undefined1 *)((long)&pnVar13->size + (ulong)(uVar6 * (int)plStackY_358[1] + uVar39)) = 1;
        if (0 < (int)*puVar32) {
          lVar12 = 0;
          do {
            iVar25 = *(int *)((long)&prVar9->x1 + lVar12 * 8 + 4);
            uVar39 = *(int *)(&prVar9->x1 + lVar12) - 1;
            do {
              uVar36 = iVar25 - 2;
              do {
                uVar36 = uVar36 + 1;
                if ((((-1 < (int)(uVar36 | uVar39)) && ((int)uVar39 < (int)plStackY_358[1])) &&
                    ((int)uVar36 < *(int *)((long)plStackY_358 + 0xc))) &&
                   ((*(char *)(*plStackY_358 + (ulong)((int)plStackY_358[1] * uVar36 + uVar39)) !=
                     '\x01' &&
                    (iVar25 = isaligned(uVar39,uVar36,angles,in_R9->x1,prec), iVar25 != 0)))) {
                  *(undefined1 *)(*plStackY_358 + (ulong)((int)plStackY_358[1] * uVar36 + uVar39)) =
                       1;
                  *(uint *)(&prVar9->x1 + (int)*puVar32) = uVar39;
                  *(uint *)((long)&prVar9->x1 + (long)(int)*puVar32 * 8 + 4) = uVar36;
                  *puVar32 = *puVar32 + 1;
                  dVar42 = cos(angles->data[angles->xsize * uVar36 + uVar39]);
                  dStackY_3b8 = dStackY_3b8 + dVar42;
                  dVar42 = sin(angles->data[angles->xsize * uVar36 + uVar39]);
                  dStackY_3a8 = dStackY_3a8 + dVar42;
                  dVar42 = atan2(dStackY_3a8,dStackY_3b8);
                  in_R9->x1 = dVar42;
                }
                iVar25 = *(int *)((long)&prVar9->x1 + lVar12 * 8 + 4);
              } while ((int)uVar36 <= iVar25);
              bVar2 = (int)uVar39 <= *(int *)(&prVar9->x1 + lVar12);
              uVar39 = uVar39 + 1;
            } while (bVar2);
            pnVar13 = (ntuple_list)(long)(int)*puVar32;
            lVar12 = lVar12 + 1;
          } while (lVar12 < (long)pnVar13);
        }
        return pnVar13;
      }
      goto LAB_001062e6;
    }
  }
  region_grow();
  piVar29 = piVar8;
  if (piVar8 == (image_double)0x0) {
LAB_0010679e:
    region2rect();
LAB_001067a3:
    region2rect();
LAB_001067a8:
    region2rect();
  }
  else {
    if ((int)uVar6 < 2) goto LAB_001067a3;
    if ((extraout_RDX_00 == (long *)0x0) || (lVar12 = *extraout_RDX_00, lVar12 == 0)) {
      region2rect();
      piVar29 = piVar8;
LAB_00106799:
      region2rect();
      goto LAB_0010679e;
    }
    if (prVar9 == (rect *)0x0) goto LAB_001067a8;
    pnVar41 = (ntuple_list)(ulong)uVar6;
    auVar57 = ZEXT816(0);
    auVar45._0_8_ = 0.0;
    pnVar13 = (ntuple_list)0x0;
    do {
      iVar25 = (int)(&piVar8->data)[(long)pnVar13];
      iVar38 = (int)((ulong)(&piVar8->data)[(long)pnVar13] >> 0x20);
      piVar29 = (image_double)(ulong)(uint)(iVar25 + iVar38 * (int)extraout_RDX_00[1]);
      dVar47 = *(double *)(lVar12 + (long)piVar29 * 8);
      auVar45._0_8_ = auVar45._0_8_ + dVar47;
      dVar60 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + dVar47 * (double)iVar25;
      auVar57._8_8_ = dVar60 + dVar47 * (double)iVar38;
      pnVar13 = (ntuple_list)((long)&pnVar13->size + 1);
    } while (pnVar41 != pnVar13);
    if (0.0 < auVar45._0_8_) {
      if (dVar42 < 0.0) goto LAB_001067b2;
      auVar45._8_8_ = auVar45._0_8_;
      auVar58 = divpd(auVar57,auVar45);
      dVar47 = 0.0;
      dVar60 = 0.0;
      auVar45._0_8_ = 0.0;
      pnVar13 = (ntuple_list)0x0;
      do {
        iVar25 = (int)(&piVar8->data)[(long)pnVar13];
        iVar38 = (int)((ulong)(&piVar8->data)[(long)pnVar13] >> 0x20);
        uVar39 = iVar38 * (int)extraout_RDX_00[1];
        dVar55 = *(double *)(lVar12 + (ulong)(iVar25 + uVar39) * 8);
        dVar56 = auVar58._0_8_;
        dVar43 = (double)iVar25 - dVar56;
        dVar59 = auVar58._8_8_;
        dVar46 = (double)iVar38 - dVar59;
        dVar47 = dVar47 + dVar55 * dVar43 * dVar43;
        dVar60 = dVar60 + dVar55 * dVar46 * dVar46;
        auVar45._0_8_ = auVar45._0_8_ - dVar46 * dVar43 * dVar55;
        pnVar13 = (ntuple_list)((long)&pnVar13->size + 1);
      } while (pnVar41 != pnVar13);
      if ((dVar60 != 0.0) || (NAN(dVar60))) {
        dVar43 = ABS(dVar60);
        dVar55 = dVar43;
        if (dVar43 <= 0.0) {
          dVar55 = 0.0;
        }
        uVar52 = 0;
        uVar53 = 0x100000;
        if (2.2250738585072014e-308 <= dVar55) {
          uVar52 = SUB84(dVar55,0);
          uVar53 = (undefined4)((ulong)dVar55 >> 0x20);
        }
        if (2.220446049250313e-14 < dVar43 / (double)CONCAT44(uVar53,uVar52)) goto LAB_001064eb;
      }
      if ((dVar47 != 0.0) || (NAN(dVar47))) {
        dVar43 = ABS(dVar47);
        dVar55 = dVar43;
        if (dVar43 <= 0.0) {
          dVar55 = 0.0;
        }
        dVar46 = 2.2250738585072014e-308;
        if (2.2250738585072014e-308 <= dVar55) {
          dVar46 = dVar55;
        }
        if (2.220446049250313e-14 < dVar43 / dVar46) goto LAB_001064eb;
      }
      piVar29 = (image_double)(ulong)uVar39;
      if ((auVar45._0_8_ != 0.0) || (NAN(auVar45._0_8_))) {
        dVar43 = ABS(auVar45._0_8_);
        dVar55 = dVar43;
        if (dVar43 <= 0.0) {
          dVar55 = 0.0;
        }
        dVar46 = 2.2250738585072014e-308;
        if (2.2250738585072014e-308 <= dVar55) {
          dVar46 = dVar55;
        }
        if (2.220446049250313e-14 < dVar43 / dVar46) {
LAB_001064eb:
          dVar55 = (dVar60 - dVar47) * (dVar60 - dVar47) + auVar45._0_8_ * 4.0 * auVar45._0_8_;
          if (dVar55 < 0.0) {
            dVar55 = sqrt(dVar55);
          }
          else {
            dVar55 = SQRT(dVar55);
          }
          dVar55 = ((dVar47 + dVar60) - dVar55) * 0.5;
          if (ABS(dVar60) <= ABS(dVar47)) {
            dVar55 = dVar55 - dVar47;
            dVar47 = auVar45._0_8_;
          }
          else {
            dVar47 = dVar55 - dVar60;
            dVar55 = auVar45._0_8_;
          }
          dVar47 = atan2(dVar47,dVar55);
          for (auVar45._0_8_ = dVar47 - extraout_XMM0_Qa_00; auVar45._0_8_ <= -3.141592653589793;
              auVar45._0_8_ = auVar45._0_8_ + 6.28318530718) {
          }
          for (; 3.141592653589793 < auVar45._0_8_; auVar45._0_8_ = auVar45._0_8_ + -6.28318530718)
          {
          }
          dVar60 = -auVar45._0_8_;
          if (-auVar45._0_8_ <= auVar45._0_8_) {
            dVar60 = auVar45._0_8_;
          }
          dVar60 = (double)(~-(ulong)(dVar42 < dVar60) & (ulong)dVar47 |
                           (ulong)(dVar47 + 3.141592653589793) & -(ulong)(dVar42 < dVar60));
          auVar45._0_8_ = cos(dVar60);
          dVar47 = sin(dVar60);
          auVar58 = ZEXT816(0);
          pnVar13 = (ntuple_list)0x0;
          auVar50 = ZEXT816(0);
          do {
            dVar55 = (double)*(int *)(&piVar8->data + (long)pnVar13) - dVar56;
            dVar43 = (double)*(int *)((long)&piVar8->data + (long)pnVar13 * 8 + 4) - dVar59;
            auVar48._0_8_ = dVar55 * auVar45._0_8_ + dVar43 * dVar47;
            auVar48._8_8_ = -dVar55 * dVar47 + dVar43 * auVar45._0_8_;
            auVar54._8_8_ = auVar48._8_8_;
            auVar54._0_8_ = auVar48._0_8_;
            auVar50 = maxpd(auVar54,auVar50);
            auVar58 = minpd(auVar48,auVar58);
            pnVar13 = (ntuple_list)((long)&pnVar13->size + 1);
          } while (pnVar41 != pnVar13);
          prVar9->x1 = auVar58._0_8_ * auVar45._0_8_ + dVar56;
          prVar9->y1 = auVar58._0_8_ * dVar47 + dVar59;
          prVar9->x2 = auVar50._0_8_ * auVar45._0_8_ + dVar56;
          prVar9->y2 = auVar50._0_8_ * dVar47 + dVar59;
          dVar55 = auVar50._8_8_ - auVar58._8_8_;
          prVar9->width = dVar55;
          prVar9->x = dVar56;
          prVar9->y = dVar59;
          prVar9->theta = dVar60;
          prVar9->dx = auVar45._0_8_;
          prVar9->dy = dVar47;
          prVar9->prec = dVar42;
          prVar9->p = quant;
          if (dVar55 < 1.0) {
            pnVar13 = (ntuple_list)0x3ff0000000000000;
            prVar9->width = 1.0;
          }
          return pnVar13;
        }
      }
      goto LAB_00106799;
    }
  }
  region2rect();
LAB_001067b2:
  region2rect();
  pnVar13 = LineSegmentDetection(piVar29,scale_00,0.6,2.0,22.5,0.0,0.7,0x400,255.0,(image_int *)0x0)
  ;
  return pnVar13;
code_r0x00104f47:
  local_f0 = (coorlist *)0x0;
  goto LAB_00105bc9;
}

Assistant:

ntuple_list LineSegmentDetection( image_double image, double scale,
                                  double sigma_scale, double quant,
                                  double ang_th, double eps, double density_th,
                                  int n_bins, double max_grad,
                                  image_int *region )
{
    ntuple_list out = new_ntuple_list(5);
    image_double scaled_image, angles, modgrad;
    image_char used;
    struct coorlist *list_p;
    void *mem_p;
    struct rect rec;
    struct point *reg;
    int reg_size, min_reg_size, i;
    unsigned int xsize, ysize;
    double rho, reg_angle, prec, p, log_nfa, logNT;
    int ls_count = 0;                   /* line segments are numbered 1,2,3,... */


    /* check parameters */
    if ( image == NULL || image->data == NULL || image->xsize == 0 || image->ysize == 0 )
        error("invalid image input.");
    if ( scale <= 0.0 ) error("'scale' value must be positive.");
    if ( sigma_scale <= 0.0 ) error("'sigma_scale' value must be positive.");
    if ( quant < 0.0 ) error("'quant' value must be positive.");
    if ( ang_th <= 0.0 || ang_th >= 180.0 )
        error("'ang_th' value must be in the range (0,180).");
    if ( density_th < 0.0 || density_th > 1.0 )
        error("'density_th' value must be in the range [0,1].");
    if ( n_bins <= 0 ) error("'n_bins' value must be positive.");
    if ( max_grad <= 0.0 ) error("'max_grad' value must be positive.");


    /* angle tolerance */
    prec = M_PI * ang_th / 180.0;
    p = ang_th / 180.0;
    rho = quant / sin(prec); /* gradient magnitude threshold */


    /* scale image (if necessary) and compute angle at each pixel */
    if ( scale != 1.0 )
    {
        scaled_image = gaussian_sampler( image, scale, sigma_scale );
        angles = ll_angle( scaled_image, rho, &list_p, &mem_p,
                           &modgrad, (unsigned int) n_bins, max_grad );
        free_image_double(scaled_image);
    }
    else
        angles = ll_angle( image, rho, &list_p, &mem_p, &modgrad,
                           (unsigned int) n_bins, max_grad );
    xsize = angles->xsize;
    ysize = angles->ysize;
    logNT = 5.0 * ( log10( (double) xsize ) + log10( (double) ysize ) ) / 2.0;
    min_reg_size = (int) (-logNT / log10(p)); /* minimal number of points in region
                                             that can give a meaningful event */


    /* initialize some structures */
    if ( region != NULL ) /* image to output pixel region number, if asked */
        *region = new_image_int_ini(angles->xsize, angles->ysize, 0);
    used = new_image_char_ini(xsize, ysize, NOTUSED);
    reg = (struct point *) calloc( (size_t) (xsize * ysize), sizeof(struct point) );
    if ( reg == NULL ) error("not enough memory!");


    /* search for line segments */
    for (; list_p != NULL; list_p = list_p->next )
        if ( used->data[ list_p->x + list_p->y * used->xsize ] == NOTUSED &&
                angles->data[ list_p->x + list_p->y * angles->xsize ] != NOTDEF )
            /* there is no risk of double comparison problems here
               because we are only interested in the exact NOTDEF value */
        {
            /* find the region of connected point and ~equal angle */
            region_grow( list_p->x, list_p->y, angles, reg, &reg_size,
                         &reg_angle, used, prec );

            /* reject small regions */
            if ( reg_size < min_reg_size ) continue;

            /* construct rectangular approximation for the region */
            region2rect(reg, reg_size, modgrad, reg_angle, prec, p, &rec);

            /* Check if the rectangle exceeds the minimal density of
               region points. If not, try to improve the region.
               The rectangle will be rejected if the final one does
               not fulfill the minimal density condition.
               This is an addition to the original LSD algorithm published in
               "LSD: A Fast Line Segment Detector with a False Detection Control"
               by R. Grompone von Gioi, J. Jakubowicz, J.M. Morel, and G. Randall.
               The original algorithm is obtained with density_th = 0.0.
             */
            if ( !refine( reg, &reg_size, modgrad, reg_angle,
                          prec, p, &rec, used, angles, density_th ) ) continue;

            /* compute NFA value */
            log_nfa = rect_improve(&rec, angles, logNT, eps);
            if ( log_nfa <= eps ) continue;

            /* A New Line Segment was found! */
            ++ls_count;  /* increase line segment counter */

            /*
               The gradient was computed with a 2x2 mask, its value corresponds to
               points with an offset of (0.5,0.5), that should be added to output.
               The coordinates origin is at the center of pixel (0,0).
             */
            rec.x1 += 0.5; rec.y1 += 0.5;
            rec.x2 += 0.5; rec.y2 += 0.5;

            /* scale the result values if a subsampling was performed */
            if ( scale != 1.0 )
            {
                rec.x1 /= scale; rec.y1 /= scale;
                rec.x2 /= scale; rec.y2 /= scale;
                rec.width /= scale;
            }

            /* add line segment found to output */
            add_5tuple(out, rec.x1, rec.y1, rec.x2, rec.y2, rec.width);

            /* add region number to 'region' image if needed */
            if ( region != NULL )
                for (i = 0; i < reg_size; i++)
                    (*region)->data[reg[i].x + reg[i].y * (*region)->xsize] = ls_count;
        }


    /* free memory */
    free_image_double(angles);
    free_image_double(modgrad);
    free_image_char(used);
    free( (void *) reg );
    free( (void *) mem_p );

    return out;
}